

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

double __thiscall IF97::Region3::mu0(Region3 *this,double T)

{
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar7 = T / 647.096;
  piVar2 = (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = 0.0;
  lVar5 = (long)(this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 2;
    lVar6 = 0;
    do {
      uVar1 = piVar2[lVar6];
      dVar8 = 1.0;
      if (uVar1 != 0) {
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        dVar9 = 1.0 / dVar7;
        if (-1 < (int)uVar1) {
          dVar9 = dVar7;
        }
        dVar8 = 1.0;
        do {
          if ((uVar4 & 1) != 0) {
            dVar8 = dVar8 * dVar9;
          }
          dVar9 = dVar9 * dVar9;
          bVar3 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
        } while (bVar3);
      }
      dVar10 = dVar10 + (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6] / dVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  return (dVar7 * 100.0) / dVar10;
}

Assistant:

double mu0(double T) const{
            const double T_bar = T/Tcrit;
            double summer = 0.0;
            for (std::size_t i = 0; i < muJ0.size(); ++i)
            {
                summer += mun0[i]/powi(T_bar, muJ0[i]);
            }
            return 100.0*sqrt(T_bar)/summer;
        }